

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS ref_inflate_compact_rail(REF_INT *n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  int iVar1;
  double dVar2;
  REF_DBL tol;
  int local_38;
  REF_INT max;
  REF_INT compact;
  REF_INT orig;
  REF_DBL *phi_local;
  REF_DBL *yz_local;
  REF_DBL *x_local;
  REF_INT *n_local;
  
  if (*n != 0) {
    iVar1 = *n;
    local_38 = 0;
    for (max = 1; max < iVar1; max = max + 1) {
      if (x[max] - x[local_38] <= 1e-08) {
        dVar2 = x[max] - x[local_38];
      }
      else {
        dVar2 = x[max] - x[local_38];
      }
      if (1e-08 < dVar2) {
        local_38 = local_38 + 1;
      }
      if (max != local_38) {
        x[local_38] = x[max];
        yz[local_38 << 1] = yz[max << 1];
        yz[local_38 * 2 + 1] = yz[max * 2 + 1];
        phi[local_38] = phi[max];
      }
    }
    *n = local_38 + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_compact_rail(REF_INT *n, REF_DBL *x, REF_DBL *yz,
                                            REF_DBL *phi) {
  REF_INT orig, compact, max;
  REF_DBL tol = 1e-8;
  if (0 == *n) return REF_SUCCESS;

  max = *n;
  compact = 0;

  for (orig = 1; orig < max; orig++) {
    if (ABS(x[orig] - x[compact] > tol)) {
      compact++;
    }
    if (orig != compact) {
      x[compact] = x[orig];
      yz[0 + 2 * compact] = yz[0 + 2 * orig];
      yz[1 + 2 * compact] = yz[1 + 2 * orig];
      phi[compact] = phi[orig];
    }
  }
  *n = compact + 1;

  return REF_SUCCESS;
}